

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateQualifiedName(DescriptorBuilder *this,string *name)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  
  sVar2 = name->_M_string_length;
  if (sVar2 == 0) {
    bVar4 = false;
  }
  else {
    sVar5 = 0;
    bVar4 = false;
    do {
      bVar1 = (name->_M_dataplus)._M_p[sVar5];
      if (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)) {
        bVar3 = false;
      }
      else if ((bVar1 != 0x2e) || (bVar3 = true, bVar4)) {
        return false;
      }
      bVar4 = bVar3;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return (bool)((bVar4 ^ 1U) & sVar2 != 0);
}

Assistant:

bool DescriptorBuilder::ValidateQualifiedName(const string& name) {
  bool last_was_period = false;

  for (int i = 0; i < name.size(); i++) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= name[i] && name[i] <= 'z') ||
        ('A' <= name[i] && name[i] <= 'Z') ||
        ('0' <= name[i] && name[i] <= '9') ||
        (name[i] == '_')) {
      last_was_period = false;
    } else if (name[i] == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}